

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.c
# Opt level: O2

ll_node * wal_read(sptr_t data,sptr_t palette)

{
  char *pcVar1;
  uint uVar2;
  int j;
  int32_t iVar3;
  undefined4 uVar4;
  wal_dk_header *out;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  ll_node *plVar8;
  size_t sVar9;
  long lVar10;
  uchar *puVar11;
  size_t sVar12;
  uint uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uchar *buffer;
  undefined4 uVar16;
  long lVar17;
  uint uVar18;
  undefined4 *puVar19;
  ulong uVar20;
  bool bVar21;
  sptr_t sVar22;
  size_t sStack_340;
  size_t local_308 [4];
  undefined1 local_2e8 [8];
  undefined1 local_2e0 [4];
  undefined4 local_2dc [3];
  undefined8 local_2d0 [2];
  undefined4 local_2c0 [164];
  
  sVar9 = palette.size;
  puVar11 = palette.ptr;
  buffer = data.ptr;
  if (data.size < 0x37c || buffer == (uchar *)0x0) {
    return (ll_node *)0x0;
  }
  iVar3 = wal_get_type(buffer);
  if (iVar3 == 2) {
    out = (wal_dk_header *)xmalloc(0x37c);
    wal_dk_read_header(buffer,out);
    if (puVar11 == (uchar *)0x0) {
      sVar9 = 0x300;
      puVar11 = out->palette;
    }
    uVar7 = (ulong)(out->height * out->width);
    uVar20 = 1;
    for (lVar17 = 0; lVar17 != 9; lVar17 = lVar17 + 1) {
      sVar22 = sptr_slice(data,(ulong)out->offsets[lVar17],uVar7);
      sVar12 = sVar22.size;
      if (sVar22.ptr == (uchar *)0x0) goto LAB_00103ac5;
      pvVar5 = xmalloc(sVar12);
      memcpy(pvVar5,sVar22.ptr,sVar12);
      sVar6 = 0;
      do {
        uVar14 = 1;
        if (sVar12 == sVar6) {
          uVar16 = 0;
          break;
        }
        pcVar1 = (char *)((long)pvVar5 + sVar6);
        sVar6 = sVar6 + 1;
        uVar16 = uVar14;
      } while (*pcVar1 != -1);
      uVar18 = (uint)uVar20;
      uVar15 = (int)(out->width / uVar20);
      if (out->width < uVar18) {
        uVar15 = uVar14;
      }
      uVar4 = (int)(out->height / uVar20);
      if (out->height < uVar18) {
        uVar4 = uVar14;
      }
      lVar10 = lVar17 * 0x50;
      local_308[lVar17 * 10] = (size_t)pvVar5;
      local_308[lVar17 * 10 + 1] = sVar12;
      local_308[lVar17 * 10 + 2] = (size_t)puVar11;
      *(size_t *)(local_2e8 + lVar10 + -8) = sVar9;
      local_2e8[lVar10] = 1;
      local_2e0[lVar10] = 2;
      local_2dc[lVar17 * 0x14] = uVar15;
      local_2dc[lVar17 * 0x14 + 1] = uVar4;
      local_2d0[lVar17 * 10] = out;
      local_2d0[lVar17 * 10 + 1] = 0;
      bVar21 = uVar7 < 4;
      uVar7 = uVar7 >> 2;
      if (bVar21) {
        uVar7 = 1;
      }
      local_2c0[lVar17 * 0x14] = uVar16;
      uVar20 = (ulong)(uVar18 * 2);
    }
    sStack_340 = 9;
  }
  else {
    if (iVar3 != 1) {
      return (ll_node *)0x0;
    }
    out = (wal_dk_header *)xmalloc(100);
    wal_q2_read_header(buffer,(wal_q2_header *)out);
    uVar7 = (ulong)(out->width * *(uint32_t *)(out->name + 0x1c));
    puVar19 = local_2c0;
    for (lVar17 = 10; lVar17 != 0xe; lVar17 = lVar17 + 1) {
      sVar22 = sptr_slice(data,(ulong)*(uint *)(out->padding + lVar17 * 4 + -1),uVar7);
      sVar12 = sVar22.size;
      if (sVar22.ptr == (uchar *)0x0) {
LAB_00103ac5:
        free(out);
        return (ll_node *)0x0;
      }
      pvVar5 = xmalloc(sVar12);
      memcpy(pvVar5,sVar22.ptr,sVar12);
      uVar13 = (int)lVar17 - 9;
      uVar18 = *(uint *)(out->name + 0x1c);
      uVar2 = out->width;
      *(void **)(puVar19 + -0x12) = pvVar5;
      *(size_t *)(puVar19 + -0x10) = sVar12;
      *(uchar **)(puVar19 + -0xe) = puVar11;
      *(size_t *)(puVar19 + -0xc) = sVar9;
      *(undefined1 *)(puVar19 + -10) = 1;
      *(undefined1 *)(puVar19 + -8) = 1;
      puVar19[-7] = uVar18 / uVar13;
      puVar19[-6] = uVar2 / uVar13;
      *(wal_dk_header **)(puVar19 + -4) = out;
      *(undefined8 *)(puVar19 + -2) = 0;
      *puVar19 = 0;
      bVar21 = uVar7 < 4;
      uVar7 = uVar7 >> 2;
      if (bVar21) {
        uVar7 = 1;
      }
      puVar19 = puVar19 + 0x14;
    }
    sStack_340 = 4;
  }
  plVar8 = ll_from_array(local_308,0x50,sStack_340);
  return plVar8;
}

Assistant:

struct ll_node *wal_read(const sptr_t data, const sptr_t palette)
{
	if (SPTR_IS_NULL(data)) {
		return NULL;
	}
	/* Daikatana header is bigger */
	if (data.size < WAL_DK_HEADER_SIZE) {
		return NULL;
	}
	switch (wal_get_type(data.ptr)) {
		case WAL_TYPE_QUAKE2:
			return wal_q2_read(data, palette);
		case WAL_TYPE_DAIKATANA:
			return wal_dk_read(data, palette);
		default:
			return NULL;
	}
}